

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O2

BoxArray * __thiscall amrex::BoxArray::growLo(BoxArray *this,int dir,int n_cell)

{
  int *piVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  uniqify(this);
  peVar2 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar3 = *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  uVar4 = ((long)*(pointer *)
                  ((long)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data + 8) - lVar3) / 0x1c;
  uVar6 = 0;
  uVar5 = uVar4 & 0xffffffff;
  if ((int)uVar4 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 * 0x1c - uVar6 != 0; uVar6 = uVar6 + 0x1c) {
    piVar1 = (int *)(lVar3 + (long)dir * 4 + uVar6);
    *piVar1 = *piVar1 - n_cell;
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::growLo (int dir,
                  int n_cell)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].growLo(dir, n_cell);
    }
    return *this;
}